

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Tracks::AddTrack(Tracks *this,Track *track,int32_t number)

{
  Track **ppTVar1;
  uint uVar2;
  uint32_t i;
  Track **ppTVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (number < 0) {
    return false;
  }
  if (((uint)number < 0x7f) && (this->wrote_tracks_ == false)) {
    uVar6 = (ulong)this->track_entries_size_;
    if (number == 0) {
LAB_0011d272:
      uVar5 = this->track_entries_size_ + 1;
      ppTVar3 = (Track **)operator_new__((ulong)uVar5 * 8,(nothrow_t *)&std::nothrow);
      if (ppTVar3 != (Track **)0x0) {
        ppTVar1 = this->track_entries_;
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          ppTVar3[uVar4] = ppTVar1[uVar4];
        }
        if (ppTVar1 != (Track **)0x0) {
          operator_delete__(ppTVar1);
          uVar6 = (ulong)this->track_entries_size_;
        }
        uVar2 = uVar5;
        if (number == 0) {
          do {
            number = uVar2;
            uVar4 = 0;
            do {
              if (uVar6 == uVar4) goto LAB_0011d2c2;
              ppTVar1 = ppTVar3 + uVar4;
              uVar4 = uVar4 + 1;
            } while ((*ppTVar1)->number_ != (ulong)(uint)number);
            uVar2 = number + 1;
          } while( true );
        }
LAB_0011d2c2:
        track->number_ = (ulong)(uint)number;
        this->track_entries_ = ppTVar3;
        ppTVar3[uVar6] = track;
        this->track_entries_size_ = uVar5;
        return true;
      }
    }
    else {
      uVar4 = 0;
      do {
        if (uVar6 == uVar4) goto LAB_0011d272;
        ppTVar3 = this->track_entries_ + uVar4;
        uVar4 = uVar4 + 1;
      } while ((*ppTVar3)->number_ != (ulong)(uint)number);
    }
  }
  return false;
}

Assistant:

bool Tracks::AddTrack(Track* track, int32_t number) {
  if (number < 0 || wrote_tracks_)
    return false;

  // This muxer only supports track numbers in the range [1, 126], in
  // order to be able (to use Matroska integer representation) to
  // serialize the block header (of which the track number is a part)
  // for a frame using exactly 4 bytes.

  if (number > 0x7E)
    return false;

  uint32_t track_num = number;

  if (track_num > 0) {
    // Check to make sure a track does not already have |track_num|.
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      if (track_entries_[i]->number() == track_num)
        return false;
    }
  }

  const uint32_t count = track_entries_size_ + 1;

  Track** const track_entries = new (std::nothrow) Track*[count];  // NOLINT
  if (!track_entries)
    return false;

  for (uint32_t i = 0; i < track_entries_size_; ++i) {
    track_entries[i] = track_entries_[i];
  }

  delete[] track_entries_;

  // Find the lowest availible track number > 0.
  if (track_num == 0) {
    track_num = count;

    // Check to make sure a track does not already have |track_num|.
    bool exit = false;
    do {
      exit = true;
      for (uint32_t i = 0; i < track_entries_size_; ++i) {
        if (track_entries[i]->number() == track_num) {
          track_num++;
          exit = false;
          break;
        }
      }
    } while (!exit);
  }
  track->set_number(track_num);

  track_entries_ = track_entries;
  track_entries_[track_entries_size_] = track;
  track_entries_size_ = count;
  return true;
}